

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::InternalSwap
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *other)

{
  BiDirectionalLSTMLayerParams *other_local;
  BiDirectionalLSTMLayerParams *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,
             &(other->activationsforwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,
             &(other->activationsbackwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->weightparams_).super_RepeatedPtrFieldBase,
             &(other->weightparams_).super_RepeatedPtrFieldBase);
  std::swap<CoreML::Specification::LSTMParams*>(&this->params_,&other->params_);
  std::swap<unsigned_long>(&this->inputvectorsize_,&other->inputvectorsize_);
  std::swap<unsigned_long>(&this->outputvectorsize_,&other->outputvectorsize_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::InternalSwap(BiDirectionalLSTMLayerParams* other) {
  activationsforwardlstm_.InternalSwap(&other->activationsforwardlstm_);
  activationsbackwardlstm_.InternalSwap(&other->activationsbackwardlstm_);
  weightparams_.InternalSwap(&other->weightparams_);
  std::swap(params_, other->params_);
  std::swap(inputvectorsize_, other->inputvectorsize_);
  std::swap(outputvectorsize_, other->outputvectorsize_);
  std::swap(_cached_size_, other->_cached_size_);
}